

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:330:68)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:330:68)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  bool bVar2;
  property_attribute attributes;
  int iVar3;
  value *pvVar4;
  void *pvVar5;
  long *plVar6;
  uint *puVar7;
  undefined4 *puVar8;
  int *piVar9;
  object *this_00;
  undefined8 *puVar10;
  long *plVar11;
  anon_class_16_1_570cf4e1_for_f *this_01;
  gc_heap_ptr_untyped *this_02;
  gc_heap *this_03;
  wstring_view name;
  object_ptr desc;
  string p;
  object_ptr o;
  vector<mjs::string,_std::allocator<mjs::string>_> local_c8;
  undefined1 local_b0 [24];
  undefined1 local_98 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_90;
  undefined1 local_70 [16];
  gc_heap_ptr_untyped local_60;
  undefined1 local_50 [32];
  
  this_01 = &this->f;
  local_b0._16_8_ = __return_storage_ptr__;
  pvVar4 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)local_50,pvVar4);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
      -0x33333333 < 2) {
    pvVar4 = (value *)&value::undefined;
  }
  else {
    pvVar4 = pvVar1 + 1;
  }
  to_string((mjs *)(local_70 + 0x10),*(gc_heap **)((long)pvVar5 + 8),pvVar4);
  plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_50);
  puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_70 + 0x10));
  local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)(puVar7 + 1);
  local_98 = (undefined1  [8])(ulong)*puVar7;
  attributes = (**(code **)(*plVar6 + 0x30))(plVar6);
  if (invalid < attributes) {
    __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                  ,0x24,"bool mjs::is_valid(property_attribute)");
  }
  if (attributes == invalid) {
    value::value((value *)local_b0._16_8_,(value *)&value::undefined);
  }
  else {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
    global_object::make_object((global_object *)local_b0);
    bVar2 = has_attributes(attributes,accessor);
    if (bVar2) {
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_50);
      puVar8 = (undefined4 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_70 + 0x10));
      name._M_str._0_4_ = *puVar8;
      name._M_len = (size_t)pvVar5;
      name._M_str._4_4_ = 0;
      object::get_accessor_property_object((object *)local_70,name);
      if (((gc_heap *)local_b0._0_8_ == (gc_heap *)0x0) ||
         ((gc_heap *)local_70._0_8_ == (gc_heap *)0x0)) {
LAB_001587e3:
        __assert_fail("dst && src && src->class_name().view() == L\"Accessor\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                      ,0x49,
                      "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
                     );
      }
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
      object::class_name((object *)local_98);
      piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
      if ((*piVar9 != 8) || (iVar3 = wmemcmp(piVar9 + 1,L"Accessor",8), iVar3 != 0))
      goto LAB_001587e3;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
      this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
      object::own_property_names(&local_c8,this_00,false);
      if ((long)local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                super__Vector_impl_data._M_start != 0x30) {
        __assert_fail("names.size() == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                      ,0x4b,
                      "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
                     );
      }
      if (local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_03 = (gc_heap *)
                  local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_03);
          if ((((*piVar9 != 3) || (iVar3 = wmemcmp(piVar9 + 1,L"get",3), iVar3 != 0)) &&
              ((piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_03),
               *piVar9 != 3 || (iVar3 = wmemcmp(piVar9 + 1,L"set",3), iVar3 != 0)))) &&
             ((piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_03),
              *piVar9 != 10 || (iVar3 = wmemcmp(piVar9 + 1,L"__strict__",10), iVar3 != 0)))) {
            __assert_fail("p.view() == L\"get\" || p.view() == L\"set\" || p.view() == L\"__strict__\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                          ,0x4d,
                          "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
                         );
          }
          piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_03);
          if ((*piVar9 != 10) || (iVar3 = wmemcmp(piVar9 + 1,L"__strict__",10), iVar3 != 0)) {
            plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
            puVar10 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
            puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_03);
            local_50._24_8_ = puVar7 + 1;
            local_50._16_8_ = ZEXT48(*puVar7);
            (**(code **)*puVar10)((value *)local_98,puVar10,local_50 + 0x10);
            (**(code **)(*plVar6 + 8))(plVar6,this_03,(value *)local_98,0);
            value::destroy((value *)local_98);
          }
          this_03 = (gc_heap *)&this_03->alloc_context_;
        } while (this_03 !=
                 (gc_heap *)
                 local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_c8);
      this_02 = (gc_heap_ptr_untyped *)local_70;
    }
    else {
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
      plVar11 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
      (**(code **)(*plVar11 + 0x98))(&local_c8,plVar11,"value");
      puVar10 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_50);
      puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_70 + 0x10));
      local_50._24_8_ = puVar7 + 1;
      local_50._16_8_ = ZEXT48(*puVar7);
      (**(code **)*puVar10)(local_98,puVar10);
      (**(code **)(*plVar6 + 8))(plVar6,&local_c8,local_98,0);
      value::destroy((value *)local_98);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
      plVar11 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
      (**(code **)(*plVar11 + 0x98))(&local_c8,plVar11,"writable");
      local_98._0_4_ = 2;
      local_90.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)(CONCAT71(local_90._1_7_,~(byte)attributes) & 0xffffffffffffff01);
      (**(code **)(*plVar6 + 8))(plVar6,&local_c8,local_98,0);
      value::destroy((value *)local_98);
      this_02 = (gc_heap_ptr_untyped *)&local_c8;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(this_02);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
    plVar11 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
    (**(code **)(*plVar11 + 0x98))(&local_c8,plVar11,"enumerable");
    local_98._0_4_ = 2;
    local_90.b_ = (attributes & dont_enum) == none;
    (**(code **)(*plVar6 + 8))(plVar6,&local_c8,local_98,0);
    value::destroy((value *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b0);
    plVar11 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
    (**(code **)(*plVar11 + 0x98))(&local_c8,plVar11,"configurable");
    local_98._0_4_ = 2;
    local_90.b_ = (attributes & dont_delete) == none;
    (**(code **)(*plVar6 + 8))(plVar6,&local_c8,local_98,0);
    value::destroy((value *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    *(value_type *)local_b0._16_8_ = object;
    (((anon_union_32_5_7b1e0779_for_value_3 *)(local_b0._16_8_ + 8))->s_).
    super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_b0._0_8_;
    *(undefined4 *)((long)(local_b0._16_8_ + 8) + 8) = local_b0._8_4_;
    if ((gc_heap *)local_b0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,
                      (gc_heap_ptr_untyped *)
                      &((anon_union_32_5_7b1e0779_for_value_3 *)(local_b0._16_8_ + 8))->s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b0);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_70 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
  return (value *)local_b0._16_8_;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }